

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atkdp.cpp
# Opt level: O3

void atkdp(int bomberNum)

{
  int k;
  long lVar1;
  BelongStructure (*paBVar2) [5];
  BelongStructure (*paaaBVar3) [5] [5] [5];
  BelongStructure (*paBVar4) [5];
  int j;
  long lVar5;
  long lVar6;
  int i;
  long lVar7;
  
  paaaBVar3 = dpRes;
  lVar7 = 0;
  do {
    lVar5 = 0;
    paBVar4 = (BelongStructure (*) [5])paaaBVar3;
    do {
      lVar1 = 0;
      paBVar2 = paBVar4;
      do {
        lVar6 = 0;
        do {
          clearBelonging((BelongStructure *)
                         ((long)&(*(BelongStructure (*) [5] [5])*paBVar2)[0][0].biggestAtk + lVar6))
          ;
          lVar6 = lVar6 + 0x38;
        } while (lVar6 != 0x118);
        lVar1 = lVar1 + 1;
        paBVar2 = paBVar2 + 1;
      } while (lVar1 != 5);
      lVar5 = lVar5 + 1;
      paBVar4 = paBVar4 + 5;
    } while (lVar5 != 5);
    lVar7 = lVar7 + 1;
    paaaBVar3 = (BelongStructure (*) [5] [5] [5])((long)paaaBVar3 + 7000);
  } while (lVar7 != 5);
  memset(dpRes,0,35000);
  shipAtk[0] = 0;
  shipAtk[1] = 0;
  shipAtk[2] = 0;
  shipAtk[3] = 0;
  shipAccu[0] = 0;
  shipAccu[1] = 0;
  shipAccu[2] = 0;
  shipAccu[3] = 0;
  usedGrid[0] = 0;
  usedGrid[1] = 0;
  usedGrid[2] = 0;
  usedGrid[3] = 0;
  anothersearch(bomberNum,0,checkNew);
  anothersearch(bomberNum,0,pushNew);
  return;
}

Assistant:

void atkdp(int bomberNum){
    //init
    for(int i=0;i<5;i++)
        for(int j=0;j<5;j++)
            for(int k=0;k<5;k++)
                for(int l=0;l<5;l++)
                    clearBelonging(&dpRes[i][j][k][l]);
    memset(dpRes,0,sizeof(dpRes));
    memset(shipAtk,0,sizeof(shipAtk));
    memset(shipAccu,0,sizeof(shipAccu));
    memset(usedGrid,0,sizeof(usedGrid));

    //search
    anothersearch(bomberNum,0,checkNew);
    anothersearch(bomberNum,0,pushNew);
}